

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sink.hpp
# Opt level: O1

void __thiscall jsoncons::stream_sink<wchar_t>::~stream_sink(stream_sink<wchar_t> *this)

{
  pointer pwVar1;
  
  std::wostream::write((wchar_t *)this->stream_ptr_,(long)this->begin_buffer_);
  std::wostream::flush();
  pwVar1 = (this->buffer_).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pwVar1 != (pointer)0x0) {
    operator_delete(pwVar1,(long)(this->buffer_).
                                 super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pwVar1);
    return;
  }
  return;
}

Assistant:

~stream_sink() noexcept
        {
            stream_ptr_->write(begin_buffer_, buffer_length());
            stream_ptr_->flush();
        }